

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O3

void uv__drain(uv_stream_t *stream)

{
  byte *pbVar1;
  uv_shutdown_t *puVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  
  if (stream->write_queue != (void **)stream->write_queue[0]) {
    __assert_fail("QUEUE_EMPTY(&stream->write_queue)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x296,"void uv__drain(uv_stream_t *)");
  }
  uVar3 = stream->flags;
  if ((uVar3 & 1) == 0) {
    uv__io_stop(stream->loop,&stream->io_watcher,4);
    uVar3 = stream->flags;
  }
  if ((uVar3 >> 8 & 1) != 0) {
    puVar2 = stream->shutdown_req;
    if (puVar2 == (uv_shutdown_t *)0x0) {
      __assert_fail("req",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x2a0,"void uv__drain(uv_stream_t *)");
    }
    if ((uVar3 & 0x201) != 0x200) {
      stream->shutdown_req = (uv_shutdown_t *)0x0;
      stream->flags = uVar3 & 0xfffffeff;
      uVar3 = (stream->loop->active_reqs).count;
      if (uVar3 == 0) {
        __assert_fail("uv__has_active_reqs(stream->loop)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                      ,0x2a6,"void uv__drain(uv_stream_t *)");
      }
      (stream->loop->active_reqs).count = uVar3 - 1;
      iVar4 = -0x7d;
      if ((stream->flags & 1) == 0) {
        iVar4 = shutdown((stream->io_watcher).fd,1);
        if (iVar4 == 0) {
          pbVar1 = (byte *)((long)&stream->flags + 1);
          *pbVar1 = *pbVar1 | 2;
          iVar4 = 0;
        }
        else {
          piVar5 = __errno_location();
          iVar4 = -*piVar5;
        }
      }
      if (puVar2->cb != (uv_shutdown_cb)0x0) {
        (*puVar2->cb)(puVar2,iVar4);
        return;
      }
    }
  }
  return;
}

Assistant:

static void uv__drain(uv_stream_t* stream) {
  uv_shutdown_t* req;
  int err;

  assert(QUEUE_EMPTY(&stream->write_queue));
  if (!(stream->flags & UV_HANDLE_CLOSING)) {
    uv__io_stop(stream->loop, &stream->io_watcher, POLLOUT);
    uv__stream_osx_interrupt_select(stream);
  }

  if (!(stream->flags & UV_HANDLE_SHUTTING))
    return;

  req = stream->shutdown_req;
  assert(req);

  if ((stream->flags & UV_HANDLE_CLOSING) ||
      !(stream->flags & UV_HANDLE_SHUT)) {
    stream->shutdown_req = NULL;
    stream->flags &= ~UV_HANDLE_SHUTTING;
    uv__req_unregister(stream->loop, req);

    err = 0;
    if (stream->flags & UV_HANDLE_CLOSING)
      /* The user destroyed the stream before we got to do the shutdown. */
      err = UV_ECANCELED;
    else if (shutdown(uv__stream_fd(stream), SHUT_WR))
      err = UV__ERR(errno);
    else /* Success. */
      stream->flags |= UV_HANDLE_SHUT;

    if (req->cb != NULL)
      req->cb(req, err);
  }
}